

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::DeleteItem
               (RecyclableObject *object,uint64 index,PropertyOperationFlags propertyOperationFlags)

{
  int iVar1;
  PropertyRecord *local_28;
  PropertyRecord *propertyRecord;
  
  local_28 = (PropertyRecord *)0x0;
  GetPropertyIdForInt(index,(((((object->type).ptr)->javascriptLibrary).ptr)->
                            super_JavascriptLibraryBase).scriptContext.ptr,&local_28);
  iVar1 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x21])
                    (object,(ulong)(uint)local_28->pid,(ulong)propertyOperationFlags);
  return iVar1;
}

Assistant:

BOOL JavascriptOperators::DeleteItem(RecyclableObject* object, uint64 index, PropertyOperationFlags propertyOperationFlags)
    {
        PropertyRecord const * propertyRecord = nullptr;
        JavascriptOperators::GetPropertyIdForInt(index, object->GetScriptContext(), &propertyRecord);
        return JavascriptOperators::DeleteProperty(object, propertyRecord->GetPropertyId(), propertyOperationFlags);
    }